

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::peer_connection_handle::peer_log
          (peer_connection_handle *this,direction_t direction,char *event,char *fmt,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  shared_ptr<libtorrent::aux::peer_connection> pc;
  va_list v;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> local_108;
  undefined8 local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b8 = in_R8;
  local_b0 = in_R9;
  ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,this);
  local_f0 = &pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  local_f8 = 0x3000000020;
  local_e8 = local_d8;
  aux::peer_connection::peer_log(local_108._M_ptr,direction,event,fmt);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  return;
}

Assistant:

void peer_connection_handle::peer_log(peer_log_alert::direction_t direction
	, char const* event, char const* fmt, ...) const
{
#ifndef TORRENT_DISABLE_LOGGING
	std::shared_ptr<aux::peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	va_list v;
	va_start(v, fmt);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#pragma clang diagnostic ignored "-Wclass-varargs"
#endif
	pc->peer_log(direction, event, fmt, v);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
	va_end(v);
#else // TORRENT_DISABLE_LOGGING
	TORRENT_UNUSED(direction);
	TORRENT_UNUSED(event);
	TORRENT_UNUSED(fmt);
#endif
}